

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall qclab::qgates::Hadamard<float>::Hadamard(Hadamard<float> *this,int qubit)

{
  int qubit_local;
  Hadamard<float> *this_local;
  
  QGate1<float>::QGate1(&this->super_QGate1<float>,qubit);
  (this->super_QGate1<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0017b048;
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }